

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcolor.cpp
# Opt level: O3

void test_colors(wins *wins_ar,int ar_len)

{
  undefined8 *puVar1;
  Am_Drawonable *d;
  long lVar2;
  Am_Style local_38 [8];
  
  if (0 < ar_len) {
    lVar2 = 0;
    do {
      puVar1 = *(undefined8 **)((long)&wins_ar->root + lVar2);
      Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
      d = (Am_Drawonable *)
          (**(code **)*puVar1)(puVar1,10,0x32,300,0x1e0,"","",1,0,local_38,0,1,1,0,0,1,0,0,1,0);
      Am_Style::~Am_Style(local_38);
      *(Am_Drawonable **)((long)&wins_ar->color_win + lVar2) = d;
      draw_colors(d);
      (**(code **)(*(long *)d + 0xa0))(d);
      lVar2 = lVar2 + 0x40;
    } while ((ulong)(uint)ar_len << 6 != lVar2);
  }
  return;
}

Assistant:

void
test_colors(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *the_color_win = (wins_ar[i].root)->Create(10, 50, 300, 480);
    wins_ar[i].color_win = the_color_win;
    draw_colors(the_color_win);
    the_color_win->Flush_Output();
  }
}